

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::addK
          (UncoreMinimize *this,Solver *s,uint32 k,LitPair *lits,uint32 size,weight_t w)

{
  WCTemp *this_00;
  OptParams OVar1;
  uint32 size_00;
  Literal LVar2;
  Var VVar3;
  ulong uVar4;
  LitPair LVar5;
  pointer lits_00;
  uint uVar6;
  undefined4 in_register_00000084;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  LitPair *pLVar10;
  bool bVar11;
  double dVar12;
  Result RVar13;
  Literal bin [2];
  undefined8 local_88;
  Literal local_7c;
  undefined8 local_78;
  undefined8 local_70;
  OptParams local_68;
  uint local_64;
  uint local_60;
  weight_t local_5c;
  LitPair *local_58;
  ulong local_50;
  Solver *local_48;
  ulong local_40;
  UncoreMinimize *local_38;
  
  OVar1 = this->options_;
  local_5c = w;
  if (k == 0) {
    local_40 = 1;
    if (8 < size) {
      local_78 = (double)size;
      dVar12 = log10(local_78);
      dVar12 = ceil(local_78 / ((dVar12 * 16.0 + -2.0) * 0.5));
      local_40 = (ulong)(uint)(int)dVar12;
    }
  }
  else {
    local_40 = (ulong)((size + k) - 1) / (ulong)k;
  }
  local_88 = 0;
  local_40 = ((size + (int)local_40) - 1) / local_40;
  local_7c.rep_ = (lits->lit).rep_ & 0xfffffffe ^ 2;
  local_64 = (int)local_40 + 1;
  this_00 = &this->temp_;
  uVar9 = 1;
  local_78 = (double)(CONCAT44(local_78._4_4_,(uint)OVar1 >> 9) & 0xffffffff00000001);
  local_68 = OVar1;
  local_58 = lits;
  local_50 = CONCAT44(in_register_00000084,size);
  local_48 = s;
  local_38 = this;
  while( true ) {
    local_60 = uVar9 + (int)local_40;
    uVar6 = (uint)local_50;
    bVar11 = local_60 < uVar6;
    uVar8 = (ulong)(uVar6 - uVar9);
    uVar6 = uVar6 - uVar9;
    if (bVar11) {
      uVar8 = local_40 & 0xffffffff;
      uVar6 = local_64;
    }
    (this->temp_).lits.ebo_.size = 0;
    (this->temp_).bound = uVar6;
    WCTemp::add(this_00,s,local_7c);
    pLVar10 = local_58;
    uVar7 = uVar8;
    s = local_48;
    this = local_38;
    uVar6 = (uint)uVar8;
    while (local_48 = s, local_38 = this, uVar6 != 0) {
      uVar4 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
      WCTemp::add(this_00,s,(Literal)(pLVar10[uVar4].lit.rep_ & 0xfffffffe ^ 2));
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      s = local_48;
      this = local_38;
    }
    if (local_60 < (uint)local_50) {
      this->auxAdd_ = this->auxAdd_ + 1;
      VVar3 = Solver::pushAuxVar(s);
      local_7c.rep_ = VVar3 * 4;
      local_88 = CONCAT44(local_88._4_4_,local_7c.rep_);
      WCTemp::add(this_00,s,(Literal)(VVar3 * 4 + 2));
    }
    if ((uint)uVar8 != 0) {
      uVar7 = (ulong)bVar11;
      do {
        this->auxAdd_ = this->auxAdd_ + 1;
        VVar3 = Solver::pushAuxVar(s);
        LVar5 = newAssumption(this,(Literal)(VVar3 * 4),local_5c);
        *(uint32 *)((long)&local_88 + uVar7 * 4) = LVar5.lit.rep_.rep_;
        WCTemp::add(this_00,s,(Literal)(LVar5.lit.rep_.rep_ & 0xfffffffe ^ 2));
        if ((int)uVar7 != 0) {
          LVar2.rep_ = local_88._4_4_;
          addImplication(this,s,local_88._0_4_,local_88._4_4_,SUB81(local_78,0));
          local_88 = CONCAT44(local_88._4_4_,LVar2.rep_);
        }
        uVar7 = 1;
        uVar6 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar6;
      } while (uVar6 != 0);
    }
    size_00 = (this->temp_).lits.ebo_.size;
    if (size_00 == 0) {
      lits_00 = (WeightLiteral *)0x0;
    }
    else {
      lits_00 = (this->temp_).lits.ebo_.buf;
    }
    bVar11 = addConstraint(this,s,lits_00,size_00,(this->temp_).bound);
    if (!bVar11) break;
    if (uVar9 == (uint)local_50) {
      if (((uint)local_68 & 0x200) == 0 && (s->conflict_).ebo_.size == 0) {
        if ((uint)local_50 != 0) {
          uVar8 = local_50 & 0xffffffff;
          pLVar10 = local_58;
          do {
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (&this->conflict_,&pLVar10->lit);
            pLVar10 = pLVar10 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        if (this->eRoot_ != 0) {
          uVar9 = 1;
          do {
            local_70 = (ClauseHead *)
                       (CONCAT44(local_70._4_4_,
                                 *(undefined4 *)
                                  ((long)&((s->assign_).trail.ebo_.buf)->rep_ +
                                  (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf +
                                                        (uVar9 - 1)) << 2))) & 0xfffffffffffffffe ^
                       2);
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (&this->conflict_,(Literal *)&local_70);
            uVar9 = uVar9 + 1;
          } while (uVar9 <= this->eRoot_);
        }
        local_70 = (ClauseHead *)CONCAT44(local_70._4_4_,0x30000000);
        RVar13 = ClauseCreator::create(s,&this->conflict_,0xb,(ConstraintInfo *)&local_70);
        local_70 = RVar13.local;
        if (local_70 != (ClauseHead *)0x0) {
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
                    (&this->closed_,(Constraint **)&local_70);
        }
        (this->conflict_).ebo_.size = 0;
      }
      return (s->conflict_).ebo_.size == 0;
    }
  }
  return false;
}

Assistant:

bool UncoreMinimize::addK(Solver& s, uint32 k, const LitPair* lits, uint32 size, weight_t w) {
	const bool concise = options_.hasOption(OptParams::usc_succinct);
	const int x = k ? (size + (k-1)) / k
	            : size <= 8 ? 1
	            : (int)std::ceil(size / (((std::log10(size)*16)-2)/2.0));
	k = (size + (x-1)) / x;
	uint32 idx = 1;
	Literal cp = ~lits[0].lit, bin[2];
	do {
		uint32 n = k, connect = uint32((idx + k) < size);
		if (!connect) {
			n = size - idx;
		}
		weight_t B = static_cast<weight_t>(n + connect);
		temp_.start(B);
		temp_.add(s, cp);
		for (uint32 i = 0; i != n; ++i) {
			temp_.add(s, ~lits[idx++].lit);
		}
		if (connect) {
			bin[0] = newLit(s);
			temp_.add(s, ~bin[0]);
			cp = bin[0];
		}
		for (uint32 i = 0, b = connect; i != n; ++i, b = 1) {
			Literal ri = newAssumption(newLit(s), w).lit;
			bin[b] = ri;
			temp_.add(s, ~ri);
			if (b) { // bin[0] -> bin[1];
				addImplication(s, bin[0], bin[1], concise);
				bin[0] = bin[1];
			}
		}
		if (!addConstraint(s, temp_.begin(), temp_.size(), temp_.bound)) {
			return false;
		}
	} while (idx != size);
	if (!concise && !s.hasConflict()) {
		typedef ClauseCreator::Result Result;
		const uint32 flags = ClauseCreator::clause_explicit | ClauseCreator::clause_not_root_sat | ClauseCreator::clause_no_add;
		for (uint32 i = 0; i != size; ++i)   { conflict_.push_back(lits[i].lit); }
		for (uint32 i = 1; i <= eRoot_; ++i) { conflict_.push_back(~s.decision(i)); }
		Result res = ClauseCreator::create(s, conflict_, flags, Constraint_t::Other);
		if (res.local) { closed_.push_back(res.local); }
		conflict_.clear();
	}
	return !s.hasConflict();
}